

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CsrPoslist(Fts5Cursor *pCsr,int iPhrase,u8 **pa,int *pn)

{
  long lVar1;
  Fts5Sorter *pFVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Fts5PoslistPopulator *aPopulator_00;
  int *in_RCX;
  u8 **in_RDX;
  int in_ESI;
  Fts5Cursor *in_RDI;
  long in_FS_OFFSET;
  int i1;
  Fts5Sorter *pSorter;
  int i;
  Fts5PoslistPopulator *aPopulator;
  int bLive;
  int rc;
  Fts5Config *pConfig;
  int n;
  char *z;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff9c;
  char **in_stack_ffffffffffffffa0;
  Fts5Config *pConfig_00;
  int local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pConfig_00 = (Fts5Config *)(in_RDI->base).pVtab[1].pModule;
  local_18 = 0;
  uVar4 = (uint)(in_RDI->pSorter == (Fts5Sorter *)0x0);
  iVar6 = in_ESI;
  if ((in_ESI < 0) || (iVar5 = sqlite3Fts5ExprPhraseCount(in_RDI->pExpr), iVar5 <= in_ESI)) {
    local_18 = 0x19;
  }
  else {
    if ((pConfig_00->eDetail != 0) &&
       (iVar5 = fts5IsContentless((Fts5FullTable *)(in_RDI->base).pVtab,1), iVar5 != 0)) {
      *in_RDX = (u8 *)0x0;
      *in_RCX = 0;
      local_18 = 0;
      goto LAB_00285534;
    }
    if ((in_RDI->csrflags & 0x40U) != 0) {
      if (pConfig_00->eDetail != 0) {
        aPopulator_00 = sqlite3Fts5ExprClearPoslists((Fts5Expr *)&DAT_aaaaaaaaaaaaaaaa,-0x55555556);
        if (aPopulator_00 == (Fts5PoslistPopulator *)0x0) {
          local_18 = 7;
        }
        if (local_18 == 0) {
          local_18 = fts5SeekCursor(in_RDI,iVar6);
        }
        iVar5 = 0;
        while( true ) {
          uVar3 = in_stack_ffffffffffffff94 & 0xffffff;
          if (iVar5 < pConfig_00->nCol) {
            uVar3 = CONCAT13(local_18 == 0,(int3)in_stack_ffffffffffffff94);
          }
          in_stack_ffffffffffffff94 = uVar3;
          if ((char)(in_stack_ffffffffffffff94 >> 0x18) == '\0') break;
          local_18 = fts5TextFromStmt((Fts5Config *)CONCAT44(local_18,uVar4),
                                      (sqlite3_stmt *)aPopulator_00,iVar5,in_stack_ffffffffffffffa0,
                                      (int *)CONCAT44(in_stack_ffffffffffffff9c,in_ESI));
          if (local_18 == 0) {
            local_18 = sqlite3Fts5ExprPopulatePoslists
                                 (pConfig_00,(Fts5Expr *)(ulong)uVar4,aPopulator_00,iVar5,
                                  (char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          }
          sqlite3Fts5ClearLocale((Fts5Config *)0x28540c);
          iVar5 = iVar5 + 1;
        }
        sqlite3_free((void *)0x285426);
        if (in_RDI->pSorter != (Fts5Sorter *)0x0) {
          sqlite3Fts5ExprCheckPoslists
                    ((Fts5Expr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        }
      }
      in_RDI->csrflags = in_RDI->csrflags & 0xffffffbf;
    }
  }
  if (local_18 == 0) {
    if ((in_RDI->pSorter == (Fts5Sorter *)0x0) || (pConfig_00->eDetail != 0)) {
      iVar6 = sqlite3Fts5ExprPoslist(in_RDI->pExpr,iVar6,in_RDX);
      *in_RCX = iVar6;
    }
    else {
      pFVar2 = in_RDI->pSorter;
      if (iVar6 == 0) {
        iVar5 = 0;
      }
      else {
        iVar5 = pFVar2->aIdx[iVar6 + -1];
      }
      *in_RCX = pFVar2->aIdx[iVar6] - iVar5;
      *in_RDX = pFVar2->aPoslist + iVar5;
    }
  }
  else {
    *in_RDX = (u8 *)0x0;
    *in_RCX = 0;
  }
LAB_00285534:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

static int fts5CsrPoslist(
  Fts5Cursor *pCsr,               /* Fts5 cursor object */
  int iPhrase,                    /* Phrase to find position list for */
  const u8 **pa,                  /* OUT: Pointer to position list buffer */
  int *pn                         /* OUT: Size of (*pa) in bytes */
){
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;
  int rc = SQLITE_OK;
  int bLive = (pCsr->pSorter==0);

  if( iPhrase<0 || iPhrase>=sqlite3Fts5ExprPhraseCount(pCsr->pExpr) ){
    rc = SQLITE_RANGE;
  }else if( pConfig->eDetail!=FTS5_DETAIL_FULL
         && fts5IsContentless((Fts5FullTable*)pCsr->base.pVtab, 1)
  ){
    *pa = 0;
    *pn = 0;
    return SQLITE_OK;
  }else if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_POSLIST) ){
    if( pConfig->eDetail!=FTS5_DETAIL_FULL ){
      Fts5PoslistPopulator *aPopulator;
      int i;

      aPopulator = sqlite3Fts5ExprClearPoslists(pCsr->pExpr, bLive);
      if( aPopulator==0 ) rc = SQLITE_NOMEM;
      if( rc==SQLITE_OK ){
        rc = fts5SeekCursor(pCsr, 0);
      }
      for(i=0; i<pConfig->nCol && rc==SQLITE_OK; i++){
        const char *z = 0;
        int n = 0;
        rc = fts5TextFromStmt(pConfig, pCsr->pStmt, i, &z, &n);
        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5ExprPopulatePoslists(
              pConfig, pCsr->pExpr, aPopulator, i, z, n
          );
        }
        sqlite3Fts5ClearLocale(pConfig);
      }
      sqlite3_free(aPopulator);

      if( pCsr->pSorter ){
        sqlite3Fts5ExprCheckPoslists(pCsr->pExpr, pCsr->pSorter->iRowid);
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_POSLIST);
  }

  if( rc==SQLITE_OK ){
    if( pCsr->pSorter && pConfig->eDetail==FTS5_DETAIL_FULL ){
      Fts5Sorter *pSorter = pCsr->pSorter;
      int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
      *pn = pSorter->aIdx[iPhrase] - i1;
      *pa = &pSorter->aPoslist[i1];
    }else{
      *pn = sqlite3Fts5ExprPoslist(pCsr->pExpr, iPhrase, pa);
    }
  }else{
    *pa = 0;
    *pn = 0;
  }

  return rc;
}